

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-handle-allocator.cc
# Opt level: O0

void handle_allocator_test(void)

{
  uint64_t uVar1;
  pointer puVar2;
  bool bVar3;
  result_type_conflict rVar4;
  int64_t iVar5;
  iterator __first;
  iterator __last;
  size_type sVar6;
  reference pvVar7;
  pointer puVar8;
  size_type sVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_2820;
  const_iterator local_2818;
  unsigned_long *local_2810;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_2808;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_2800;
  const_iterator local_27f8;
  reference local_27f0;
  uint64_t *last;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_27e0;
  unsigned_long local_27d8;
  uint64_t handle_1;
  size_t i_4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> handles;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  unsigned_long local_2788;
  uint64_t handle;
  size_t i;
  undefined1 local_2770 [7];
  bool ok;
  HandleAllocator<unsigned_long> allocator;
  vector<unsigned_long,_std::allocator<unsigned_long>_> perm_handles;
  uint64_t n;
  undefined1 local_2718 [8];
  mt19937 engine;
  random_device seed_gen;
  
  std::random_device::random_device((random_device *)&engine._M_p);
  rVar4 = std::random_device::operator()((random_device *)&engine._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2718,(ulong)rVar4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator.dirty_);
  tinyusdz::HandleAllocator<unsigned_long>::HandleAllocator
            ((HandleAllocator<unsigned_long> *)local_2770);
  i._7_1_ = 1;
  for (handle = 0; handle < 0x4000; handle = handle + 1) {
    bVar3 = tinyusdz::HandleAllocator<unsigned_long>::Allocate
                      ((HandleAllocator<unsigned_long> *)local_2770,&local_2788);
    if (!bVar3) {
      i._7_1_ = 0;
      break;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator.dirty_,
               &local_2788);
  }
  acutest_check_(i._7_1_ & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x27,"%s","ok");
  iVar5 = tinyusdz::HandleAllocator<unsigned_long>::Size
                    ((HandleAllocator<unsigned_long> *)local_2770);
  acutest_check_((uint)(iVar5 == 0x4000),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x28,"%s","allocator.Size() == n");
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator.dirty_);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator.dirty_);
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2718);
  i._7_1_ = 1;
  i_2 = 0;
  while( true ) {
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator.dirty_);
    if (sVar6 <= i_2) break;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator.dirty_,
                        i_2);
    bVar3 = tinyusdz::HandleAllocator<unsigned_long>::Has
                      ((HandleAllocator<unsigned_long> *)local_2770,*pvVar7);
    if (!bVar3) {
      i._7_1_ = 0;
      break;
    }
    i_2 = i_2 + 1;
  }
  acutest_check_(i._7_1_ & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x35,"%s","ok");
  i._7_1_ = 1;
  i_3 = 0;
  while( true ) {
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator.dirty_);
    if (sVar6 <= i_3) break;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator.dirty_,
                        i_3);
    bVar3 = tinyusdz::HandleAllocator<unsigned_long>::Release
                      ((HandleAllocator<unsigned_long> *)local_2770,*pvVar7);
    if (!bVar3) {
      i._7_1_ = 0;
      break;
    }
    i_3 = i_3 + 1;
  }
  acutest_check_(i._7_1_ & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x41,"%s","ok");
  iVar5 = tinyusdz::HandleAllocator<unsigned_long>::Size
                    ((HandleAllocator<unsigned_long> *)local_2770);
  acutest_check_((uint)(iVar5 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x43,"%s","allocator.Size() == 0");
  i._7_1_ = 1;
  handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    puVar2 = handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar8 = (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &allocator.dirty_);
    if (puVar8 <= puVar2) break;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator.dirty_,
                        (size_type)
                        handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar3 = tinyusdz::HandleAllocator<unsigned_long>::Has
                      ((HandleAllocator<unsigned_long> *)local_2770,*pvVar7);
    if (bVar3) {
      i._7_1_ = 0;
      break;
    }
    handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  acutest_check_(i._7_1_ & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x4e,"%s","ok");
  i._7_1_ = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_4);
  handle_1 = 0;
  do {
    uVar1 = handle_1;
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator.dirty_);
    if (sVar6 <= uVar1) {
LAB_001277f8:
      acutest_check_(i._7_1_ & 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                     ,0x5b,"%s","ok");
      local_27e0._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_4);
      last = (uint64_t *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_4);
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (local_27e0,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )last);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_4);
      acutest_check_((uint)(*pvVar7 == 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                     ,0x5f,"%s","handles.front() == 1");
      local_27f0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_4);
      acutest_check_((uint)(*local_27f0 == 0x4000),
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                     ,0x61,"%s","last == n");
      local_2808._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_4);
      local_2810 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_4);
      local_2800 = std::
                   unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                             (local_2808,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               )local_2810);
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  *)&local_27f8,&local_2800);
      local_2820._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_4);
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  *)&local_2818,&local_2820);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_4,local_27f8,local_2818
                );
      sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_4);
      sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator.dirty_)
      ;
      acutest_check_((uint)(sVar6 == sVar9),
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                     ,99,"%s","handles.size() == perm_handles.size()");
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_4);
      tinyusdz::HandleAllocator<unsigned_long>::~HandleAllocator
                ((HandleAllocator<unsigned_long> *)local_2770);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator.dirty_);
      std::random_device::~random_device((random_device *)&engine._M_p);
      return;
    }
    bVar3 = tinyusdz::HandleAllocator<unsigned_long>::Allocate
                      ((HandleAllocator<unsigned_long> *)local_2770,&local_27d8);
    if (!bVar3) {
      i._7_1_ = 0;
      goto LAB_001277f8;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_4,&local_27d8);
    handle_1 = handle_1 + 1;
  } while( true );
}

Assistant:

void handle_allocator_test(void) {

  std::random_device seed_gen;
  std::mt19937 engine(seed_gen());

  uint64_t n = 1024*16;

  std::vector<uint64_t> perm_handles;

  HandleAllocator<uint64_t> allocator;

  bool ok = true;
  for (size_t i = 0; i < n; i++) {
    uint64_t handle;
    if (!allocator.Allocate(&handle)) {
      ok = false;
      break; 
    }

    perm_handles.push_back(handle);
  }
  TEST_CHECK(ok);
  TEST_CHECK(allocator.Size() == n);

  std::shuffle(perm_handles.begin(), perm_handles.end(), engine);

  // handle should exist
  ok = true;
  for (size_t i = 0; i < perm_handles.size(); i++) {
    //std::cout << "handle = " << perm_handles[i] << ", Size = " << allocator.Size() << "\n";
    if (!allocator.Has(perm_handles[i])) {
      ok = false;
      break;
    }
  }
  TEST_CHECK(ok);

  //std::cout << "del \n";
  // delete
  ok = true;
  for (size_t i = 0; i < perm_handles.size(); i++) {
    //std::cout << "del handle " << perm_handles[i] << ", Size = " << allocator.Size() << "\n";
    if (!allocator.Release(perm_handles[i])) {
      ok = false;
      break;
    }
  }
  TEST_CHECK(ok);
  //std::cout << "del done\n";
  TEST_CHECK(allocator.Size() == 0);
  
  // no handle exists
  ok = true;
  for (size_t i = 0; i < perm_handles.size(); i++) {
    //std::cout << "has handle " << perm_handles[i] << " = " << allocator.Has(perm_handles[i]) << "\n";
    if (allocator.Has(perm_handles[i])) {
      ok = false;
      break;
    }
  }
  TEST_CHECK(ok);

  // reallocate test
  ok = true;
  std::vector<uint64_t> handles;
  for (size_t i = 0; i < perm_handles.size(); i++) {
    uint64_t handle;
    if (!allocator.Allocate(&handle)) {
      ok = false;
      break;
    }
    handles.push_back(handle);
  }
  TEST_CHECK(ok);
  // uniqueness check
  std::sort(handles.begin(), handles.end());
  // array items = [1, ..., n]
  TEST_CHECK(handles.front() == 1); 
  uint64_t &last = handles.back();
  TEST_CHECK(last == n);
  handles.erase(std::unique(handles.begin(), handles.end()), handles.end());
  TEST_CHECK(handles.size() == perm_handles.size());


}